

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

size_t __thiscall
diligent_spirv_cross::Compiler::get_declared_struct_size(Compiler *this,SPIRType *type)

{
  bool bVar1;
  uint32_t uVar2;
  CompilerError *this_00;
  size_t sVar3;
  size_t size;
  size_t offset;
  ulong uStack_30;
  uint32_t i;
  size_t highest_offset;
  uint32_t member_index;
  SPIRType *type_local;
  Compiler *this_local;
  
  bVar1 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::empty
                    (&(type->member_types).
                      super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                    );
  if (!bVar1) {
    highest_offset._0_4_ = 0;
    uStack_30 = 0;
    offset._4_4_ = 0;
    while( true ) {
      sVar3 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::size
                        (&(type->member_types).
                          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                        );
      if ((uint)sVar3 <= offset._4_4_) break;
      uVar2 = type_struct_member_offset(this,type,offset._4_4_);
      if (uStack_30 < uVar2) {
        highest_offset._0_4_ = offset._4_4_;
        uStack_30 = (ulong)uVar2;
      }
      offset._4_4_ = offset._4_4_ + 1;
    }
    sVar3 = get_declared_struct_member_size(this,type,(uint32_t)highest_offset);
    return uStack_30 + sVar3;
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError(this_00,"Declared struct in block cannot be empty.");
  __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
}

Assistant:

size_t Compiler::get_declared_struct_size(const SPIRType &type) const
{
	if (type.member_types.empty())
		SPIRV_CROSS_THROW("Declared struct in block cannot be empty.");

	// Offsets can be declared out of order, so we need to deduce the actual size
	// based on last member instead.
	uint32_t member_index = 0;
	size_t highest_offset = 0;
	for (uint32_t i = 0; i < uint32_t(type.member_types.size()); i++)
	{
		size_t offset = type_struct_member_offset(type, i);
		if (offset > highest_offset)
		{
			highest_offset = offset;
			member_index = i;
		}
	}

	size_t size = get_declared_struct_member_size(type, member_index);
	return highest_offset + size;
}